

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceSDL.h
# Opt level: O2

void __thiscall
irr::CIrrDeviceSDL::CCursorControl::setRelativeMode(CCursorControl *this,bool relative)

{
  int iVar1;
  undefined3 in_register_00000031;
  
  iVar1 = SDL_GetRelativeMouseMode();
  if (iVar1 == CONCAT31(in_register_00000031,relative)) {
    return;
  }
  SDL_SetRelativeMouseMode(relative);
  return;
}

Assistant:

virtual void setRelativeMode(bool relative) _IRR_OVERRIDE_
		{
			// Only change it when necessary, as it flushes mouse motion when enabled
			if (relative != SDL_GetRelativeMouseMode()) {
				if (relative)
					SDL_SetRelativeMouseMode(SDL_TRUE);
				else
					SDL_SetRelativeMouseMode(SDL_FALSE);
			}
		}